

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O3

int __thiscall
mkvmuxer::Segment::TestFrame
          (Segment *this,uint64_t track_number,uint64_t frame_timestamp_ns,bool is_key)

{
  uint64_t *puVar1;
  ulong uVar2;
  Track **ppTVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  Track *pTVar7;
  long lVar8;
  
  if ((this->force_new_cluster_ == false) && (0 < (long)this->cluster_list_size_)) {
    uVar2 = (this->segment_info_).timecode_scale_;
    uVar4 = frame_timestamp_ns / uVar2;
    puVar1 = &this->cluster_list_[(long)this->cluster_list_size_ + -1]->timecode_;
    lVar5 = uVar4 - *puVar1;
    if (uVar4 < *puVar1) {
      return -1;
    }
    if (0x7fff < lVar5) {
      return 2;
    }
    if (is_key) {
      ppTVar3 = (this->tracks_).track_entries_;
      pTVar7 = *ppTVar3;
      if (pTVar7->number_ != track_number) {
        lVar8 = 1;
        do {
          pTVar7 = ppTVar3[lVar8];
          lVar8 = lVar8 + 1;
        } while (pTVar7->number_ != track_number);
      }
      if (pTVar7->type_ == 1) goto LAB_00150fad;
    }
    uVar6 = 1;
    if (lVar5 * uVar2 <= this->max_cluster_duration_ - 1) {
      uVar6 = (uint)(this->max_cluster_size_ - 1 <
                    this->cluster_list_[(long)this->cluster_list_size_ + -1]->payload_size_);
    }
  }
  else {
LAB_00150fad:
    uVar6 = 1;
  }
  return uVar6;
}

Assistant:

int Segment::TestFrame(uint64_t track_number, uint64_t frame_timestamp_ns,
                       bool is_key) const {
  if (force_new_cluster_)
    return 1;

  // If no clusters have been created yet, then create a new cluster
  // and write this frame immediately, in the new cluster.  This path
  // should only be followed once, the first time we attempt to write
  // a frame.

  if (cluster_list_size_ <= 0)
    return 1;

  // There exists at least one cluster. We must compare the frame to
  // the last cluster, in order to determine whether the frame is
  // written to the existing cluster, or that a new cluster should be
  // created.

  const uint64_t timecode_scale = segment_info_.timecode_scale();
  const uint64_t frame_timecode = frame_timestamp_ns / timecode_scale;

  const Cluster* const last_cluster = cluster_list_[cluster_list_size_ - 1];
  const uint64_t last_cluster_timecode = last_cluster->timecode();

  // For completeness we test for the case when the frame's timecode
  // is less than the cluster's timecode.  Although in principle that
  // is allowed, this muxer doesn't actually write clusters like that,
  // so this indicates a bug somewhere in our algorithm.

  if (frame_timecode < last_cluster_timecode)  // should never happen
    return -1;

  // If the frame has a timestamp significantly larger than the last
  // cluster (in Matroska, cluster-relative timestamps are serialized
  // using a 16-bit signed integer), then we cannot write this frame
  // to that cluster, and so we must create a new cluster.

  const int64_t delta_timecode = frame_timecode - last_cluster_timecode;

  if (delta_timecode > kMaxBlockTimecode)
    return 2;

  // We decide to create a new cluster when we have a video keyframe.
  // This will flush queued (audio) frames, and write the keyframe
  // immediately, in the newly-created cluster.

  if (is_key && tracks_.TrackIsVideo(track_number))
    return 1;

  // Create a new cluster if we have accumulated too many frames
  // already, where "too many" is defined as "the total time of frames
  // in the cluster exceeds a threshold".

  const uint64_t delta_ns = delta_timecode * timecode_scale;

  if (max_cluster_duration_ > 0 && delta_ns >= max_cluster_duration_)
    return 1;

  // This is similar to the case above, with the difference that a new
  // cluster is created when the size of the current cluster exceeds a
  // threshold.

  const uint64_t cluster_size = last_cluster->payload_size();

  if (max_cluster_size_ > 0 && cluster_size >= max_cluster_size_)
    return 1;

  // There's no need to create a new cluster, so emit this frame now.

  return 0;
}